

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# QPDFJob.cc
# Opt level: O1

void __thiscall
QPDFJob::addOutlinesToJson
          (QPDFJob *this,
          vector<QPDFOutlineObjectHelper,_std::allocator<QPDFOutlineObjectHelper>_> *outlines,
          JSON *j,map<QPDFObjGen,_int,_std::less<QPDFObjGen>,_std::allocator<std::pair<const_QPDFObjGen,_int>_>_>
                  *page_numbers)

{
  QPDFOutlineObjectHelper *this_00;
  QPDFOutlineObjectHelper *this_01;
  undefined8 this_02;
  bool bVar1;
  int iVar2;
  const_iterator cVar3;
  mapped_type *pmVar4;
  pointer this_03;
  JSON j_destpage;
  JSON jo;
  QPDFObjectHandle page;
  JSON j_kids;
  JSON local_148;
  undefined1 local_138 [48];
  undefined1 local_108 [32];
  QPDFObjGen local_e8;
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_e0;
  QPDFObjGen local_d0;
  element_type *local_c8;
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_c0;
  pointer local_b8;
  JSON *local_b0;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *local_a0;
  JSON local_98;
  JSON local_88;
  JSON local_78;
  JSON local_68;
  JSON local_58;
  vector<QPDFOutlineObjectHelper,_std::allocator<QPDFOutlineObjectHelper>_> local_48;
  
  this_03 = (outlines->
            super__Vector_base<QPDFOutlineObjectHelper,_std::allocator<QPDFOutlineObjectHelper>_>).
            _M_impl.super__Vector_impl_data._M_start;
  local_b8 = (outlines->
             super__Vector_base<QPDFOutlineObjectHelper,_std::allocator<QPDFOutlineObjectHelper>_>).
             _M_impl.super__Vector_impl_data._M_finish;
  if (this_03 != local_b8) {
    local_c0._M_pi =
         (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
         &(page_numbers->_M_t)._M_impl.super__Rb_tree_header;
    this_01 = (QPDFOutlineObjectHelper *)((long)local_108 + 0x18);
    this_00 = (QPDFOutlineObjectHelper *)(local_138 + 0x18);
    local_138._40_8_ = page_numbers;
    local_108._16_8_ = this;
    local_b0 = j;
    do {
      JSON::makeDictionary();
      JSON::addArrayElement((JSON *)local_108,local_b0);
      if (local_148.m.super___shared_ptr<JSON::Members,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
          _M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                  (local_148.m.super___shared_ptr<JSON::Members,_(__gnu_cxx::_Lock_policy)2>.
                   _M_refcount._M_pi);
      }
      local_148.m.super___shared_ptr<JSON::Members,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
           (element_type *)local_138;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_148,"object","");
      local_138._24_8_ =
           (this_03->super_QPDFObjectHelper).super_BaseHandle.obj.
           super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
      local_138._32_8_ =
           (this_03->super_QPDFObjectHelper).super_BaseHandle.obj.
           super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi;
      if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_138._32_8_ !=
          (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        if (__libc_single_threaded == '\0') {
          LOCK();
          ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_138._32_8_)->_M_use_count =
               ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_138._32_8_)->_M_use_count + 1;
          UNLOCK();
        }
        else {
          ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_138._32_8_)->_M_use_count =
               ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_138._32_8_)->_M_use_count + 1;
        }
      }
      QPDFObjectHandle::getJSON
                ((QPDFObjectHandle *)this_01,(int)this_00,
                 SUB41(*(undefined4 *)(*(long *)local_108._16_8_ + 0x288),0));
      JSON::addDictionaryMember(&local_58,(string *)local_108,&local_148);
      if (local_58.m.super___shared_ptr<JSON::Members,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi
          != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                  (local_58.m.super___shared_ptr<JSON::Members,_(__gnu_cxx::_Lock_policy)2>.
                   _M_refcount._M_pi);
      }
      if (local_e8 != (QPDFObjGen)0x0) {
        std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                  ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_e8);
      }
      if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_138._32_8_ !=
          (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                  ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_138._32_8_);
      }
      if ((element_type *)
          local_148.m.super___shared_ptr<JSON::Members,_(__gnu_cxx::_Lock_policy)2>._M_ptr !=
          (element_type *)local_138) {
        operator_delete(local_148.m.super___shared_ptr<JSON::Members,_(__gnu_cxx::_Lock_policy)2>.
                        _M_ptr,local_138._0_8_ + 1);
      }
      local_148.m.super___shared_ptr<JSON::Members,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
           (element_type *)local_138;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_148,"title","");
      QPDFOutlineObjectHelper::getTitle_abi_cxx11_((string *)this_01,this_03);
      JSON::makeString((JSON *)this_00,(string *)this_01);
      JSON::addDictionaryMember(&local_68,(string *)local_108,&local_148);
      if (local_68.m.super___shared_ptr<JSON::Members,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi
          != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                  (local_68.m.super___shared_ptr<JSON::Members,_(__gnu_cxx::_Lock_policy)2>.
                   _M_refcount._M_pi);
      }
      if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_138._32_8_ !=
          (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                  ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_138._32_8_);
      }
      if ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)local_108._24_8_ != &local_e0) {
        operator_delete((void *)local_108._24_8_,
                        (ulong)((long)&(local_e0._M_pi)->_vptr__Sp_counted_base + 1));
      }
      if ((element_type *)
          local_148.m.super___shared_ptr<JSON::Members,_(__gnu_cxx::_Lock_policy)2>._M_ptr !=
          (element_type *)local_138) {
        operator_delete(local_148.m.super___shared_ptr<JSON::Members,_(__gnu_cxx::_Lock_policy)2>.
                        _M_ptr,local_138._0_8_ + 1);
      }
      local_148.m.super___shared_ptr<JSON::Members,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
           (element_type *)local_138;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_148,"dest","");
      QPDFOutlineObjectHelper::getDest(this_00);
      QPDFObjectHandle::getJSON
                ((QPDFObjectHandle *)this_01,(int)this_00,
                 SUB41(*(undefined4 *)(*(long *)local_108._16_8_ + 0x288),0));
      JSON::addDictionaryMember(&local_78,(string *)local_108,&local_148);
      if (local_78.m.super___shared_ptr<JSON::Members,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi
          != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                  (local_78.m.super___shared_ptr<JSON::Members,_(__gnu_cxx::_Lock_policy)2>.
                   _M_refcount._M_pi);
      }
      if (local_e8 != (QPDFObjGen)0x0) {
        std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                  ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_e8);
      }
      if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_138._32_8_ !=
          (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                  ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_138._32_8_);
      }
      if ((element_type *)
          local_148.m.super___shared_ptr<JSON::Members,_(__gnu_cxx::_Lock_policy)2>._M_ptr !=
          (element_type *)local_138) {
        operator_delete(local_148.m.super___shared_ptr<JSON::Members,_(__gnu_cxx::_Lock_policy)2>.
                        _M_ptr,local_138._0_8_ + 1);
      }
      local_148.m.super___shared_ptr<JSON::Members,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
           (element_type *)local_138;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_148,"open","");
      iVar2 = QPDFOutlineObjectHelper::getCount(this_03);
      JSON::makeBool((JSON *)this_01,(bool)((byte)~(byte)((uint)iVar2 >> 0x18) >> 7));
      JSON::addDictionaryMember(&local_88,(string *)local_108,&local_148);
      if (local_88.m.super___shared_ptr<JSON::Members,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi
          != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                  (local_88.m.super___shared_ptr<JSON::Members,_(__gnu_cxx::_Lock_policy)2>.
                   _M_refcount._M_pi);
      }
      if (local_e8 != (QPDFObjGen)0x0) {
        std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                  ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_e8);
      }
      if ((element_type *)
          local_148.m.super___shared_ptr<JSON::Members,_(__gnu_cxx::_Lock_policy)2>._M_ptr !=
          (element_type *)local_138) {
        operator_delete(local_148.m.super___shared_ptr<JSON::Members,_(__gnu_cxx::_Lock_policy)2>.
                        _M_ptr,local_138._0_8_ + 1);
      }
      QPDFOutlineObjectHelper::getDestPage(this_01);
      JSON::makeNull();
      bVar1 = QPDFObjectHandle::isIndirect((QPDFObjectHandle *)this_01);
      if (bVar1) {
        local_d0 = QPDFObjectHandle::getObjGen((QPDFObjectHandle *)this_01);
        cVar3 = std::
                _Rb_tree<QPDFObjGen,_std::pair<const_QPDFObjGen,_int>,_std::_Select1st<std::pair<const_QPDFObjGen,_int>_>,_std::less<QPDFObjGen>,_std::allocator<std::pair<const_QPDFObjGen,_int>_>_>
                ::find((_Rb_tree<QPDFObjGen,_std::pair<const_QPDFObjGen,_int>,_std::_Select1st<std::pair<const_QPDFObjGen,_int>_>,_std::less<QPDFObjGen>,_std::allocator<std::pair<const_QPDFObjGen,_int>_>_>
                        *)local_138._40_8_,&local_d0);
        if (cVar3._M_node != (_Base_ptr)local_c0._M_pi) {
          pmVar4 = std::
                   map<QPDFObjGen,_int,_std::less<QPDFObjGen>,_std::allocator<std::pair<const_QPDFObjGen,_int>_>_>
                   ::operator[]((map<QPDFObjGen,_int,_std::less<QPDFObjGen>,_std::allocator<std::pair<const_QPDFObjGen,_int>_>_>
                                 *)local_138._40_8_,&local_d0);
          JSON::makeInt(&local_148,(long)*pmVar4);
          this_02 = local_138._32_8_;
          local_138._32_8_ =
               local_148.m.super___shared_ptr<JSON::Members,_(__gnu_cxx::_Lock_policy)2>._M_refcount
               ._M_pi;
          local_138._24_8_ =
               local_148.m.super___shared_ptr<JSON::Members,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
          local_148.m.super___shared_ptr<JSON::Members,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
               (element_type *)0x0;
          local_148.m.super___shared_ptr<JSON::Members,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
          _M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
          if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)this_02 !=
              (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
            std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                      ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)this_02);
          }
          if (local_148.m.super___shared_ptr<JSON::Members,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
              _M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
            std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                      (local_148.m.super___shared_ptr<JSON::Members,_(__gnu_cxx::_Lock_policy)2>.
                       _M_refcount._M_pi);
          }
        }
      }
      local_148.m.super___shared_ptr<JSON::Members,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
           (element_type *)local_138;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_148,"destpageposfrom1","");
      JSON::addDictionaryMember(&local_98,(string *)local_108,&local_148);
      if (local_98.m.super___shared_ptr<JSON::Members,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi
          != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                  (local_98.m.super___shared_ptr<JSON::Members,_(__gnu_cxx::_Lock_policy)2>.
                   _M_refcount._M_pi);
      }
      if ((element_type *)
          local_148.m.super___shared_ptr<JSON::Members,_(__gnu_cxx::_Lock_policy)2>._M_ptr !=
          (element_type *)local_138) {
        operator_delete(local_148.m.super___shared_ptr<JSON::Members,_(__gnu_cxx::_Lock_policy)2>.
                        _M_ptr,local_138._0_8_ + 1);
      }
      local_148.m.super___shared_ptr<JSON::Members,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
           (element_type *)local_138;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_148,"kids","");
      JSON::makeArray();
      JSON::addDictionaryMember((JSON *)&local_d0,(string *)local_108,&local_148);
      if (local_a0 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_a0);
      }
      if ((element_type *)
          local_148.m.super___shared_ptr<JSON::Members,_(__gnu_cxx::_Lock_policy)2>._M_ptr !=
          (element_type *)local_138) {
        operator_delete(local_148.m.super___shared_ptr<JSON::Members,_(__gnu_cxx::_Lock_policy)2>.
                        _M_ptr,local_138._0_8_ + 1);
      }
      QPDFOutlineObjectHelper::getKids(&local_48,this_03);
      addOutlinesToJson((QPDFJob *)local_108._16_8_,&local_48,(JSON *)&local_d0,
                        (map<QPDFObjGen,_int,_std::less<QPDFObjGen>,_std::allocator<std::pair<const_QPDFObjGen,_int>_>_>
                         *)local_138._40_8_);
      std::vector<QPDFOutlineObjectHelper,_std::allocator<QPDFOutlineObjectHelper>_>::~vector
                (&local_48);
      if (local_c8 != (element_type *)0x0) {
        std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                  ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_c8);
      }
      if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_138._32_8_ !=
          (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                  ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_138._32_8_);
      }
      if (local_e8 != (QPDFObjGen)0x0) {
        std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                  ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_e8);
      }
      if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_108._8_8_ !=
          (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                  ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_108._8_8_);
      }
      this_03 = this_03 + 1;
    } while (this_03 != local_b8);
  }
  return;
}

Assistant:

void
QPDFJob::addOutlinesToJson(
    std::vector<QPDFOutlineObjectHelper> outlines, JSON& j, std::map<QPDFObjGen, int>& page_numbers)
{
    for (auto& ol: outlines) {
        JSON jo = j.addArrayElement(JSON::makeDictionary());
        jo.addDictionaryMember("object", ol.getObjectHandle().getJSON(m->json_version));
        jo.addDictionaryMember("title", JSON::makeString(ol.getTitle()));
        jo.addDictionaryMember("dest", ol.getDest().getJSON(m->json_version, true));
        jo.addDictionaryMember("open", JSON::makeBool(ol.getCount() >= 0));
        QPDFObjectHandle page = ol.getDestPage();
        JSON j_destpage = JSON::makeNull();
        if (page.isIndirect()) {
            QPDFObjGen og = page.getObjGen();
            if (page_numbers.count(og)) {
                j_destpage = JSON::makeInt(page_numbers[og]);
            }
        }
        jo.addDictionaryMember("destpageposfrom1", j_destpage);
        JSON j_kids = jo.addDictionaryMember("kids", JSON::makeArray());
        addOutlinesToJson(ol.getKids(), j_kids, page_numbers);
    }
}